

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_write(FIOBJ dest,char *data,size_t len)

{
  size_t sVar1;
  fio_str_info_s local_40;
  size_t local_28;
  size_t len_local;
  char *data_local;
  FIOBJ dest_local;
  
  local_28 = len;
  len_local = (size_t)data;
  data_local = (char *)dest;
  sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)(((ulong)data_local & 0xfffffffffffffff8) + 0x11) == '\0') {
      *(undefined8 *)(((ulong)data_local & 0xfffffffffffffff8) + 8) = 0;
      fio_str_write(&local_40,
                    (fio_str_s_conflict *)(((ulong)data_local & 0xfffffffffffffff8) + 0x10),
                    (void *)len_local,local_28);
      dest_local = local_40.len;
    }
    else {
      dest_local = 0;
    }
    return dest_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0xf6,"size_t fiobj_str_write(FIOBJ, const char *, size_t)");
}

Assistant:

size_t fiobj_str_write(FIOBJ dest, const char *data, size_t len) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write(&obj2str(dest)->str, data, len).len;
}